

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::detail::ParseMaterialXValue<std::__cxx11::string>
               (string *str,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value
               ,string *err)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  StreamReader sr;
  AsciiParser parser;
  string local_528;
  StreamReader local_508;
  AsciiParser local_4e8;
  
  local_508.binary_ = (uint8_t *)(str->_M_dataplus)._M_p;
  local_508.length_ = str->_M_string_length;
  local_508.swap_endian_ = false;
  local_508.idx_ = 0;
  ascii::AsciiParser::AsciiParser(&local_4e8,&local_508);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_528._M_string_length = 0;
  local_528.field_2._M_local_buf[0] = '\0';
  bVar1 = ParseValue<std::__cxx11::string>(&local_4e8,&local_528,err);
  if (bVar1) {
    ::std::__cxx11::string::_M_assign((string *)value);
  }
  ::std::__cxx11::string::_M_dispose();
  ascii::AsciiParser::~AsciiParser(&local_4e8);
  return bVar1;
}

Assistant:

bool ParseMaterialXValue(const std::string &str, T *value, std::string *err) {
  tinyusdz::StreamReader sr(reinterpret_cast<const uint8_t *>(str.data()),
                            str.size(), /* swap endian */ false);
  tinyusdz::ascii::AsciiParser parser(&sr);

  T val{};

  if (!ParseValue(parser, val, err)) {
    return false;
  }

  (*value) = val;
  return true;
}